

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexes.c
# Opt level: O1

void add_radial_scalar(FmsDataCollection dc,FmsComponent volume,char *name,int order,int *dims,
                      double *verts,int nverts,int *edges,int nedges,int *faces,int nfaces,
                      int ncells)

{
  uint uVar1;
  void *__ptr;
  long lVar2;
  double *pdVar3;
  void *data;
  ulong uVar4;
  long lVar5;
  double *pdVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  FmsFieldDescriptor fd;
  FmsMetaData mdata;
  FmsField f;
  char fdname [100];
  FmsFieldDescriptor local_b0;
  FmsMetaData local_a8;
  FmsField local_a0;
  char local_98 [104];
  
  sprintf(local_98,"%s descriptor");
  FmsDataCollectionAddFieldDescriptor(dc,local_98,&local_b0);
  FmsFieldDescriptorSetComponent(local_b0,volume);
  FmsFieldDescriptorSetFixedOrder(local_b0,FMS_CONTINUOUS,FMS_NODAL_GAUSS_CLOSED,(long)order);
  iVar7 = order + -1;
  uVar1 = ((ncells * iVar7 + nfaces) * iVar7 + nedges) * iVar7 + nverts;
  lVar9 = (long)(int)uVar1;
  __ptr = malloc(lVar9 * 0x18);
  uVar8 = (ulong)(uint)nverts;
  if (0 < nverts) {
    uVar4 = 0;
    pdVar6 = verts;
    do {
      *(double *)((long)__ptr + uVar4 * 8) = *pdVar6;
      uVar4 = uVar4 + 1;
      pdVar6 = pdVar6 + 3;
    } while (uVar8 != uVar4);
  }
  pdVar6 = (double *)((long)__ptr + lVar9 * 8);
  lVar2 = (long)nverts;
  pdVar3 = append_coord_dofs_edge
                     (order,(double *)((long)__ptr + lVar2 * 8),verts,edges,nedges,0.0,0);
  pdVar3 = append_coord_dofs_face(order,pdVar3,verts,edges,faces,nfaces,0.0,0);
  append_coord_dofs_cell(order,pdVar3,dims,verts,0.0,0);
  if (nverts < 1) {
    pdVar3 = append_coord_dofs_edge(order,pdVar6 + lVar2,verts,edges,nedges,0.0,1);
    pdVar3 = append_coord_dofs_face(order,pdVar3,verts,edges,faces,nfaces,0.0,1);
    append_coord_dofs_cell(order,pdVar3,dims,verts,0.0,1);
  }
  else {
    lVar5 = 0;
    pdVar3 = pdVar6;
    do {
      *pdVar3 = verts[lVar5 + 1];
      lVar5 = lVar5 + 3;
      pdVar3 = pdVar3 + 1;
    } while (uVar8 * 3 != lVar5);
    pdVar3 = append_coord_dofs_edge(order,pdVar6 + lVar2,verts,edges,nedges,0.0,1);
    pdVar3 = append_coord_dofs_face(order,pdVar3,verts,edges,faces,nfaces,0.0,1);
    append_coord_dofs_cell(order,pdVar3,dims,verts,0.0,1);
    if (0 < nverts) {
      pdVar3 = verts + 2;
      uVar4 = 0;
      do {
        *(double *)((long)__ptr + uVar4 * 8 + (long)(int)(uVar1 * 2) * 8) = *pdVar3;
        uVar4 = uVar4 + 1;
        pdVar3 = pdVar3 + 3;
      } while (uVar8 != uVar4);
    }
  }
  pdVar3 = append_coord_dofs_edge
                     (order,(double *)((long)__ptr + lVar2 * 8 + (long)(int)(uVar1 * 2) * 8),verts,
                      edges,nedges,0.0,2);
  pdVar3 = append_coord_dofs_face(order,pdVar3,verts,edges,faces,nfaces,0.0,2);
  append_coord_dofs_cell(order,pdVar3,dims,verts,0.0,2);
  data = malloc(lVar9 * 8);
  if (0 < (int)uVar1) {
    lVar9 = 0;
    do {
      dVar10 = *(double *)((long)__ptr + lVar9 + (long)(int)(uVar1 * 2) * 8);
      dVar10 = dVar10 * dVar10 +
               *(double *)((long)__ptr + lVar9) * *(double *)((long)__ptr + lVar9) +
               *(double *)((long)pdVar6 + lVar9) * *(double *)((long)pdVar6 + lVar9);
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      *(double *)((long)data + lVar9) = dVar10;
      lVar9 = lVar9 + 8;
    } while ((ulong)uVar1 << 3 != lVar9);
  }
  FmsDataCollectionAddField(dc,name,&local_a0);
  FmsFieldSet(local_a0,local_b0,1,FMS_BY_VDIM,FMS_DOUBLE,data);
  FmsFieldAttachMetaData(local_a0,&local_a8);
  FmsMetaDataSetString(local_a8,"units","cm");
  free(data);
  free(__ptr);
  return;
}

Assistant:

void
add_radial_scalar(FmsDataCollection dc, FmsComponent volume,
                  const char *name, int order, const int *dims,
                  const double *verts, int nverts,
                  const int *edges, int nedges,
                  const int *faces, int nfaces,
                  int ncells) {
  int i, ndofs;
  double *data, *coords, *x, *y, *z;
  char fdname[100];

  /* Create a field descriptor for the coordinates that live on "surface". */
  sprintf(fdname, "%s descriptor", name);
  FmsFieldDescriptor fd;
  FmsDataCollectionAddFieldDescriptor(dc, fdname, &fd);
  FmsFieldDescriptorSetComponent(fd, volume);
  FmsFieldDescriptorSetFixedOrder(fd, FMS_CONTINUOUS,
                                  FMS_NODAL_GAUSS_CLOSED, order);

  /* First, make coordinates of the target order. */
  ndofs = dofs_for_order(order, nverts, nedges, nfaces, ncells);

  /* Make the coordinate data. Make it BYNODE xxxx...yyyy...zzzz... */
  coords = (double *)malloc(ndofs * sizeof(double)*3);
  x = coords;
  y = coords + ndofs;
  z = coords + 2*ndofs;

  /* Store coordinate dofs by node. */
  x = append_coord_dofs_verts(x, verts, nverts, 0);
  x = append_coord_dofs_edge(order, x, verts, edges, nedges, 0., 0);
  x = append_coord_dofs_face(order, x, verts, edges, faces, nfaces, 0., 0);
  x = append_coord_dofs_cell(order, x, dims, verts, 0., 0);

  y = append_coord_dofs_verts(y, verts, nverts, 1);
  y = append_coord_dofs_edge(order, y, verts, edges, nedges, 0., 1);
  y = append_coord_dofs_face(order, y, verts, edges, faces, nfaces, 0., 1);
  y = append_coord_dofs_cell(order, y, dims, verts, 0., 1);

  z = append_coord_dofs_verts(z, verts, nverts, 2);
  z = append_coord_dofs_edge(order, z, verts, edges, nedges, 0., 2);
  z = append_coord_dofs_face(order, z, verts, edges, faces, nfaces, 0., 2);
  z = append_coord_dofs_cell(order, z, dims, verts, 0., 2);

  /* Make the radial data. */
  x = coords;
  y = coords + ndofs;
  z = coords + 2*ndofs;
  data = (double *)malloc(ndofs * sizeof(double));
  for(i = 0; i < ndofs; ++i) {
    data[i] = sqrt(x[i]*x[i] + y[i]*y[i] + z[i]*z[i]);
  }

#if 0
  /* Write coordinate dofs as Point3D so we can plot them. */
  char tmp[100];
  sprintf(tmp, "%s.3D", name);
  FILE *fp = fopen(tmp, "wt");
  fprintf(fp, "X Y Z dof\n");
  for(i = 0; i < ndofs; ++i)
    fprintf(fp, "%lg %lg 0. %f\n", coords[i*2],coords[i*2+1], data[i]);
  fclose(fp);
#endif

  /* Add the coordinates to the data collection. */
  FmsField f;
  FmsDataCollectionAddField(dc, name, &f);
  FmsFieldSet(f, fd, 1, FMS_BY_VDIM, FMS_DOUBLE, data);

  /* Add some field metadata. (optional) */
  FmsMetaData mdata;
  FmsFieldAttachMetaData(f, &mdata);
  FmsMetaDataSetString(mdata, "units", "cm");

  free(data);
  free(coords);
}